

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Double(Builder *this,double f)

{
  Value local_28;
  double local_18;
  double f_local;
  Builder *this_local;
  
  local_18 = f;
  f_local = (double)this;
  Value::Value(&local_28,f);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,&local_28);
  return;
}

Assistant:

void Double(double f) { stack_.push_back(Value(f)); }